

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall QWhatsThat::mouseReleaseEvent(QWhatsThat *this,QMouseEvent *e)

{
  Data *pDVar1;
  QWidgetData *pQVar2;
  undefined1 *puVar3;
  QArrayData *pQVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  char cVar9;
  QPointF *pQVar10;
  QObject *pQVar11;
  QPointF *pQVar12;
  long in_FS_OFFSET;
  double dVar13;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  QStringView QVar18;
  QStringView QVar19;
  QWhatsThisClickedEvent e_1;
  QPointF local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QString local_78;
  QPointF local_58;
  undefined1 *local_48;
  long local_38;
  
  pQVar10 = &local_a8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->pressed != true) goto LAB_003a0a34;
  pDVar1 = (this->widget).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      ((this->widget).wp.value != (QObject *)0x0)) &&
     ((*(int *)(e + 0x40) == 1 && (this->doc != (QTextDocument *)0x0)))) {
    pQVar2 = (this->super_QWidget).data;
    auVar15._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    auVar15._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    auVar15._8_8_ = 0;
    local_a8 = (QPointF)(auVar15 << 0x40);
    dVar13 = (double)QEventPoint::position();
    dVar13 = (double)(((ulong)dVar13 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar13;
    bVar5 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    dVar16 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    local_58.xp = (qreal)CONCAT44((int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 |
                                               ~-(ulong)bVar6 & (ulong)dVar16),
                                  (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                               ~-(ulong)bVar5 & (ulong)dVar13));
    e = (QMouseEvent *)&local_58;
    cVar9 = QRect::contains((QPoint *)&local_a8,SUB81(e,0));
    if (cVar9 != '\0') {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      e = (QMouseEvent *)QTextDocument::documentLayout();
      dVar13 = (double)QEventPoint::position();
      auVar14._0_8_ =
           (double)(((ulong)dVar13 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar13;
      auVar14._8_8_ =
           (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_00;
      auVar15 = maxpd(auVar14,_DAT_006605e0);
      uVar8 = -(ulong)(2147483647.0 < auVar14._8_8_) & 0x41dfffffffc00000;
      auVar17._0_8_ = ~-(ulong)(2147483647.0 < auVar14._0_8_) & auVar15._0_8_;
      auVar17._8_8_ = ~-(ulong)(2147483647.0 < auVar14._8_8_) & auVar15._8_8_;
      auVar7._8_4_ = (int)uVar8;
      auVar7._0_8_ = -(ulong)(2147483647.0 < auVar14._0_8_) & 0x41dfffffffc00000;
      auVar7._12_4_ = (int)(uVar8 >> 0x20);
      dVar13 = (double)((int)SUB168(auVar17 | auVar7,8) + -8);
      local_a8.yp._0_4_ = SUB84(dVar13,0);
      local_a8.xp = (double)((int)SUB168(auVar17 | auVar7,0) + -0xc);
      local_a8.yp._4_4_ = (int)((ulong)dVar13 >> 0x20);
      QAbstractTextDocumentLayout::anchorAt(&local_58);
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      pQVar12 = (QPointF *)(this->anchor).d.ptr;
      puVar3 = (undefined1 *)(this->anchor).d.size;
      if (puVar3 == local_48) {
        QVar18.m_data = (storage_type_conflict *)local_58.yp;
        QVar18.m_size = (qsizetype)puVar3;
        QVar19.m_data = (storage_type_conflict *)pQVar12;
        QVar19.m_size = (qsizetype)puVar3;
        e = (QMouseEvent *)pQVar12;
        cVar9 = QtPrivate::equalStrings(QVar19,QVar18);
        if (cVar9 != '\0') {
          e = (QMouseEvent *)&local_58;
          QString::operator=(&local_78,(QString *)e);
          pQVar12 = (QPointF *)(this->anchor).d.ptr;
        }
      }
      if (pQVar12 != (QPointF *)0x0) {
        pQVar4 = &((this->anchor).d.d)->super_QArrayData;
        (this->anchor).d.d = (Data *)0x0;
        (this->anchor).d.ptr = (char16_t *)0x0;
        (this->anchor).d.size = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            e = (QMouseEvent *)0x2;
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      if (local_78.d.size == 0) {
LAB_003a09de:
        bVar5 = true;
      }
      else {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QWhatsThisClickedEvent::QWhatsThisClickedEvent
                  ((QWhatsThisClickedEvent *)&local_a8,(QString *)&local_78);
        pDVar1 = (this->widget).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar11 = (QObject *)0x0;
        }
        else {
          pQVar11 = (this->widget).wp.value;
        }
        cVar9 = QCoreApplication::sendEvent(pQVar11,(QEvent *)&local_a8);
        QWhatsThisClickedEvent::~QWhatsThisClickedEvent((QWhatsThisClickedEvent *)&local_a8);
        e = (QMouseEvent *)pQVar10;
        if (cVar9 == '\0') goto LAB_003a09de;
        bVar5 = false;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          e = (QMouseEvent *)0x2;
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_58.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          e = (QMouseEvent *)0x2;
          QArrayData::deallocate((QArrayData *)local_58.xp,2,0x10);
        }
      }
      if (!bVar5) goto LAB_003a0a34;
    }
  }
  QWidget::close(&this->super_QWidget,(int)e);
LAB_003a0a34:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseReleaseEvent(QMouseEvent* e)
{
    if (!pressed)
        return;
    if (widget && e->button() == Qt::LeftButton && doc && rect().contains(e->position().toPoint())) {
        QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
        QString href;
        if (anchor == a)
            href = a;
        anchor.clear();
        if (!href.isEmpty()) {
            QWhatsThisClickedEvent e(href);
            if (QCoreApplication::sendEvent(widget, &e))
                return;
        }
    }
    close();
}